

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void __thiscall
wasm::Fuzzer::run(Fuzzer *this,uint64_t seed,uint64_t *latticeElementSeed,string *funcName)

{
  __node_base_ptr p_Var1;
  value_type *__val;
  long lVar2;
  ostream *poVar3;
  result_type rVar4;
  char *pcVar5;
  Function *pFVar6;
  uint64_t uVar7;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  pointer puVar8;
  ulong uVar9;
  Name NVar10;
  undefined1 local_1168 [8];
  RandEngine getRand;
  TranslateToFuzzReader reader;
  Module testModule;
  vector<char,_std::allocator<char>_> bytes;
  
  lVar2 = 1;
  uVar7 = seed;
  do {
    uVar7 = (uVar7 >> 0x3e ^ uVar7) * 0x5851f42d4c957f2d + lVar2;
    getRand._M_x[lVar2 + -1] = uVar7;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  getRand._M_x[0x137] = 0x138;
  local_1168 = (undefined1  [8])seed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running with seed ",0x12);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  testModule.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  testModule.tagsMap._M_h._M_single_bucket = (__node_base_ptr)operator_new(0x1000);
  p_Var1 = testModule.tagsMap._M_h._M_single_bucket + 0x200;
  memset(testModule.tagsMap._M_h._M_single_bucket,0,0x1000);
  if (p_Var1 != testModule.tagsMap._M_h._M_single_bucket) {
    uVar9 = 0;
    do {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                            *)local_1168);
      *(result_type *)((long)&(testModule.tagsMap._M_h._M_single_bucket)->_M_nxt + uVar9) = rVar4;
      uVar9 = uVar9 + 8;
    } while (uVar9 < (ulong)((long)p_Var1 - (long)testModule.tagsMap._M_h._M_single_bucket));
  }
  Module::Module((Module *)&reader.nesting);
  TranslateToFuzzReader::TranslateToFuzzReader
            ((TranslateToFuzzReader *)&getRand._M_p,(Module *)&reader.nesting,
             (vector<char,_std::allocator<char>_> *)&testModule.tagsMap._M_h._M_single_bucket,false)
  ;
  TranslateToFuzzReader::build((TranslateToFuzzReader *)&getRand._M_p);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Generated test module: \n",0x18);
    std::operator<<((ostream *)&std::cout,(Module *)&reader.nesting);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  }
  if (funcName == (string *)0x0 || latticeElementSeed == (uint64_t *)0x0) {
    if (testModule.exports.
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
        (pointer)testModule.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      puVar8 = testModule.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pFVar6 = (Function *)
                 (puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(char **)&((Name *)((long)&pFVar6->super_Importable + 0x20))->super_IString ==
            (char *)0x0) {
          rVar4 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                *)local_1168);
          runOnFunction(this,pFVar6,rVar4);
        }
        puVar8 = puVar8 + 1;
      } while (puVar8 != (pointer)testModule.functions.
                                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    pcVar5 = (char *)wasm::IString::interned
                               (funcName->_M_string_length,(funcName->_M_dataplus)._M_p,0);
    NVar10.super_IString.str._M_str = pcVar5;
    NVar10.super_IString.str._M_len = (size_t)&reader.nesting;
    pFVar6 = (Function *)wasm::Module::getFunction(NVar10);
    runOnFunction(this,pFVar6,*latticeElementSeed);
  }
  TranslateToFuzzReader::~TranslateToFuzzReader((TranslateToFuzzReader *)&getRand._M_p);
  Module::~Module((Module *)&reader.nesting);
  if (testModule.tagsMap._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(testModule.tagsMap._M_h._M_single_bucket,
                    (long)p_Var1 - (long)testModule.tagsMap._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void run(uint64_t seed,
           uint64_t* latticeElementSeed = nullptr,
           std::string* funcName = nullptr) {
    RandEngine getRand(seed);
    std::cout << "Running with seed " << seed << "\n";

    // 4kb of random bytes should be enough for anyone!
    std::vector<char> bytes(4096);
    for (size_t i = 0; i < bytes.size(); i += sizeof(uint64_t)) {
      *(uint64_t*)(bytes.data() + i) = getRand();
    }

    Module testModule;
    TranslateToFuzzReader reader(testModule, std::move(bytes));
    reader.build();

    if (verbose) {
      std::cout << "Generated test module: \n";
      std::cout << testModule;
      std::cout << "\n";
    }

    // If a specific function and lattice element seed is specified, only run
    // that.
    if (latticeElementSeed && funcName) {
      runOnFunction(testModule.getFunction(*funcName), *latticeElementSeed);
      return;
    }

    ModuleUtils::iterDefinedFunctions(testModule, [&](Function* func) {
      uint64_t funcSeed = getRand();
      runOnFunction(func, funcSeed);
    });
  }